

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl.cxx
# Opt level: O2

void Fl::remove_timeout(Fl_Timeout_Handler cb,void *argp)

{
  Timeout *pTVar1;
  Timeout *pTVar2;
  Timeout **ppTVar3;
  
  ppTVar3 = &first_timeout;
  pTVar2 = free_timeout;
  while (pTVar1 = *ppTVar3, pTVar1 != (Timeout *)0x0) {
    if ((pTVar1->cb == cb) && ((argp == (void *)0x0 || (pTVar1->arg == argp)))) {
      *ppTVar3 = pTVar1->next;
      pTVar1->next = pTVar2;
      pTVar2 = pTVar1;
      free_timeout = pTVar1;
    }
    else {
      ppTVar3 = &pTVar1->next;
    }
  }
  return;
}

Assistant:

void Fl::remove_timeout(Fl_Timeout_Handler cb, void *argp) {
  for (Timeout** p = &first_timeout; *p;) {
    Timeout* t = *p;
    if (t->cb == cb && (t->arg == argp || !argp)) {
      *p = t->next;
      t->next = free_timeout;
      free_timeout = t;
    } else {
      p = &(t->next);
    }
  }
}